

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareScalingFactorWithNullptrAsSecondParameter_Test::TestBody
          (Units_compareScalingFactorWithNullptrAsSecondParameter_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_100 [8];
  Message local_f8 [8];
  shared_ptr<libcellml::Units> local_f0;
  double local_e0;
  double local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8 [8];
  shared_ptr<libcellml::Units> local_b0;
  double local_a0;
  double local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u;
  Units_compareScalingFactorWithNullptrAsSecondParameter_Test *this_local;
  
  u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"u",&local_41);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,0x10,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_98 = 0.0;
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_b0,(nullptr_t)0x0);
  local_a0 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)local_20,(shared_ptr *)&local_b0,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_90,"0.0","libcellml::Units::scalingFactor(u, nullptr)",
             &local_98,&local_a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x441,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_d8 = 0.0;
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_f0,(nullptr_t)0x0);
  local_e0 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)local_20,(shared_ptr *)&local_f0,false);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_d0,"0.0","libcellml::Units::scalingFactor(u, nullptr, false)",
             &local_d8,&local_e0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x442,pcVar3);
    testing::internal::AssertHelper::operator=(local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Units, compareScalingFactorWithNullptrAsSecondParameter)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u, nullptr));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u, nullptr, false));
}